

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

int floatx80_is_quiet_nan_arm(floatx80 a,float_status *status)

{
  flag fVar1;
  ulong uVar2;
  bool local_32;
  bool local_31;
  uint64_t aLow;
  float_status *status_local;
  floatx80 a_local;
  
  uVar2 = a.low;
  fVar1 = snan_bit_is_one(status);
  if (fVar1 == '\0') {
    local_32 = (a.high & 0x7fff) == 0x7fff && 0x7fffffffffffffff < uVar2 * 2;
  }
  else {
    local_31 = false;
    local_32 = local_31;
    if (((a.high & 0x7fff) == 0x7fff) &&
       (local_31 = false, local_32 = local_31,
       ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0)) {
      local_32 = uVar2 == (uVar2 & 0xbfffffffffffffff);
    }
  }
  a_local._13_3_ = 0;
  a_local._12_1_ = local_32;
  return a_local._12_4_;
}

Assistant:

int floatx80_is_quiet_nan(floatx80 a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return floatx80_is_any_nan(a);
#else
    if (snan_bit_is_one(status)) {
        uint64_t aLow;

        aLow = a.low & ~0x4000000000000000ULL;
        return ((a.high & 0x7FFF) == 0x7FFF)
            && (aLow << 1)
            && (a.low == aLow);
    } else {
        return ((a.high & 0x7FFF) == 0x7FFF)
            && (UINT64_C(0x8000000000000000) <= ((uint64_t)(a.low << 1)));
    }
#endif
}